

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O0

void __thiscall hgdb::rtl::SymbolTableGenerator::output(SymbolTableGenerator *this)

{
  bool *this_00;
  string_view sVar1;
  string_view desc;
  __optional_eq_t<bool,_bool> _Var2;
  bool bVar3;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[2]> _Var4;
  byte bVar5;
  size_type sVar6;
  char **argv;
  pointer this_01;
  RootSymbol *pRVar7;
  iterator ppIVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  v9 *this_02;
  format_args args;
  string_view fmt;
  ostream local_ae8 [8];
  ofstream stream;
  NotSupportedException *e;
  string local_8b0 [8];
  string output;
  InstanceSymbol *instance;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *__range2;
  span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> instances;
  Serializer serializer;
  string local_7a0;
  undefined1 local_780 [8];
  SymbolTable table;
  unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> compilation;
  string local_6e0;
  v9 *local_6c0;
  char *local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string_view local_690;
  bool local_679 [8];
  undefined1 local_671;
  undefined1 auStack_670 [7];
  bool res;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_668;
  string_view local_660;
  basic_string_view<char,_std::char_traits<char>_> local_650;
  string_view local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_630 [2];
  optional<bool> local_60a;
  undefined1 local_608 [6];
  optional<bool> show_help;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filename;
  Driver driver;
  SymbolTableGenerator *this_local;
  undefined1 local_c0 [16];
  v9 *local_b0;
  char *local_a8;
  string *local_a0;
  v9 *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  char *local_80;
  v9 **local_78;
  char *local_70;
  v9 **local_68;
  v9 **local_60;
  v9 *local_58;
  char *pcStack_50;
  SymbolTableGenerator **local_40;
  undefined1 *local_38;
  SymbolTableGenerator **local_30;
  SymbolTableGenerator **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  char *local_10;
  
  this_00 = &filename.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged;
  driver._1272_8_ = this;
  slang::driver::Driver::Driver((Driver *)this_00);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_608);
  std::optional<bool>::optional(&local_60a);
  slang::driver::Driver::addStandardArgs((Driver *)this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_630,"-o");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_640,"Output symbol table file");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_650);
  sVar1._M_str = local_650._M_str;
  sVar1._M_len = local_650._M_len;
  slang::CommandLine::add
            ((CommandLine *)
             &filename.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,(string_view)local_630[0],
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_608,local_640,sVar1,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_660,"-h,--help");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_670,
             "Display available options");
  desc._M_str = (char *)local_668.values_;
  desc._M_len = _auStack_670;
  slang::CommandLine::add
            ((CommandLine *)
             &filename.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged,local_660,&local_60a,desc);
  sVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&this->commandline_args_);
  argv = std::vector<const_char_*,_std::allocator<const_char_*>_>::data(&this->commandline_args_);
  local_671 = slang::driver::Driver::parseCommandLine<char_const**>
                        ((Driver *)
                         &filename.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_engaged,(int)sVar6,argv);
  if ((bool)local_671) {
    local_679[0] = true;
    _Var2 = std::operator==(&local_60a,local_679);
    if (_Var2) {
      local_78 = &local_6c0;
      local_80 = "{}";
      local_70 = "{}";
      local_6c0 = (v9 *)0x6d8c2c;
      local_68 = local_78;
      local_6b8 = (char *)std::char_traits<char>::length("{}");
      local_10 = local_80;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&compilation,
                 "hgdb-rtl symbol table generator");
      this_02 = (v9 *)&filename.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged;
      slang::CommandLine::getHelpText_abi_cxx11_(&local_6e0,(CommandLine *)this_02,_compilation);
      local_88 = &local_6b0;
      local_98 = local_6c0;
      pcStack_90 = local_6b8;
      local_a0 = &local_6e0;
      local_60 = &local_98;
      local_b0 = local_6c0;
      local_a8 = local_6b8;
      local_58 = local_b0;
      pcStack_50 = local_a8;
      this_local = (SymbolTableGenerator *)
                   ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_a0,this_02,local_88);
      local_38 = local_c0;
      local_40 = &this_local;
      local_20 = 0xd;
      args.field_1.values_ = local_668.values_;
      args.desc_ = (unsigned_long_long)local_40;
      fmt.size_ = 0xd;
      fmt.data_ = local_a8;
      local_30 = local_40;
      local_28 = local_40;
      local_18 = local_38;
      ::fmt::v9::vformat_abi_cxx11_(&local_6b0,local_b0,fmt,args);
      local_690 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_6b0);
      slang::OS::print(local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6e0);
      local_679[1] = true;
      local_679[2] = false;
      local_679[3] = false;
      local_679[4] = false;
    }
    else {
      local_671 = slang::driver::Driver::parseAllSources
                            ((Driver *)
                             &filename.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_engaged);
      if ((bool)local_671) {
        slang::driver::Driver::createCompilation((Driver *)&table.reorder_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a0,"SystemVerilog",
                   (allocator<char> *)
                   ((long)&serializer.def_module_mapping_._M_h._M_single_bucket + 7));
        json::SymbolTable::SymbolTable((SymbolTable *)local_780,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&serializer.def_module_mapping_._M_h._M_single_bucket + 7));
        Serializer::Serializer
                  ((Serializer *)&instances.size_,(SymbolTable *)local_780,
                   (SourceManager *)
                   &driver.cmdLine.errors.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_01 = std::
                  unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
                  ::operator->((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
                                *)&table.reorder_);
        pRVar7 = slang::ast::Compilation::getRoot(this_01);
        __range2 = (span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *)
                   (pRVar7->topInstances).data_;
        instances.data_ = (pointer)(pRVar7->topInstances).size_;
        __end2 = nonstd::span_lite::
                 span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>::begin
                           ((span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *
                            )&__range2);
        ppIVar8 = nonstd::span_lite::
                  span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>::end
                            ((span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>
                              *)&__range2);
        for (; __end2 != ppIVar8; __end2 = __end2 + 1) {
          output.field_2._8_8_ = *__end2;
          slang::ast::Symbol::visit<hgdb::rtl::Serializer&>
                    ((Symbol *)output.field_2._8_8_,(Serializer *)&instances.size_);
        }
        json::SymbolTable::compress((SymbolTable *)local_780);
        std::__cxx11::string::string(local_8b0);
        json::SymbolTable::output_abi_cxx11_((string *)&e,(SymbolTable *)local_780);
        std::__cxx11::string::operator=(local_8b0,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar3 = std::optional::operator_cast_to_bool((optional *)local_608);
        if (bVar3) {
          _Var4 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_608,(char (*) [2])0x6d481b);
          if (_Var4) {
            sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_8b0)
            ;
            slang::OS::print(sVar1);
          }
          else {
            pbVar9 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_608);
            std::ofstream::ofstream(local_ae8,(string *)pbVar9,_S_out);
            bVar5 = std::ios::bad();
            if ((bVar5 & 1) == 0) {
              std::operator<<(local_ae8,local_8b0);
            }
            std::ofstream::close();
            std::ofstream::~ofstream(local_ae8);
          }
        }
        std::__cxx11::string::~string(local_8b0);
        Serializer::~Serializer((Serializer *)&instances.size_);
        json::SymbolTable::~SymbolTable((SymbolTable *)local_780);
        std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
        ~unique_ptr((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>
                     *)&table.reorder_);
        local_679[1] = false;
        local_679[2] = false;
        local_679[3] = false;
        local_679[4] = false;
      }
      else {
        local_679[1] = true;
        local_679[2] = false;
        local_679[3] = false;
        local_679[4] = false;
      }
    }
  }
  else {
    local_679[1] = true;
    local_679[2] = false;
    local_679[3] = false;
    local_679[4] = false;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_608);
  slang::driver::Driver::~Driver
            ((Driver *)
             &filename.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  return;
}

Assistant:

void SymbolTableGenerator::output() {
    slang::driver::Driver driver;
    std::optional<std::string> filename;
    std::optional<bool> show_help;
    driver.addStandardArgs();
    driver.cmdLine.add("-o", filename, "Output symbol table file");
    driver.cmdLine.add("-h,--help", show_help, "Display available options");
    bool res = driver.parseCommandLine(static_cast<int>(commandline_args_.size()),
                                       commandline_args_.data());
    if (!res) return;
    if (show_help == true) {
        slang::OS::print(
            fmt::format("{}", driver.cmdLine.getHelpText("hgdb-rtl symbol table generator")));
        return;
    }

    res = driver.parseAllSources();
    if (!res) return;
    auto compilation = driver.createCompilation();

    hgdb::json::SymbolTable table("SystemVerilog");

    Serializer serializer(table, driver.sourceManager);
    auto instances = compilation->getRoot().topInstances;
    for (auto *instance : instances) {
        instance->visit(serializer);
    }
    table.compress();

    std::string output;

    try {
        output = table.output();
    } catch (NotSupportedException &e) {
        e.report(*driver.diagClient);
    }

    if (filename) {
        if (filename == "-") {
            slang::OS::print(output);
        } else {
            std::ofstream stream(*filename);
            if (!stream.bad()) {
                stream << output;
            }
            stream.close();
        }
    }
}